

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_predefinedEntityName(ENCODING *UNUSED_enc,char *ptr,char *end)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = ((long)end - (long)ptr) / 2;
  if (lVar2 == 4) {
    if (ptr[1] == '\0') {
      if (*ptr == 'a') {
        if ((((ptr[3] == '\0') && (ptr[2] == 'p')) && (ptr[5] == '\0')) &&
           (((ptr[4] == 'o' && (ptr[7] == '\0')) && (ptr[6] == 's')))) {
          return 0x27;
        }
      }
      else if (((*ptr == 'q') && (ptr[3] == '\0')) &&
              (((ptr[2] == 'u' && (((ptr[5] == '\0' && (ptr[4] == 'o')) && (ptr[7] == '\0')))) &&
               (ptr[6] == 't')))) {
        return 0x22;
      }
    }
  }
  else if (lVar2 == 3) {
    if (((ptr[1] == '\0') && (*ptr == 'a')) &&
       (((ptr[3] == '\0' && ((ptr[2] == 'm' && (ptr[5] == '\0')))) && (ptr[4] == 'p')))) {
      return 0x26;
    }
  }
  else if (((lVar2 == 2) && (ptr[3] == '\0')) && (ptr[2] == 't')) {
    if (ptr[1] != '\0') {
      return 0;
    }
    iVar3 = 0x3e;
    if (*ptr != 'g') {
      iVar3 = 0;
    }
    iVar1 = 0x3c;
    if (*ptr != 'l') {
      iVar1 = iVar3;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(predefinedEntityName)(const ENCODING *UNUSED_P(enc), const char *ptr,
                             const char *end)
{
  switch ((end - ptr)/MINBPC(enc)) {
  case 2:
    if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_t)) {
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case ASCII_l:
        return ASCII_LT;
      case ASCII_g:
        return ASCII_GT;
      }
    }
    break;
  case 3:
    if (CHAR_MATCHES(enc, ptr, ASCII_a)) {
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_m)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_p))
          return ASCII_AMP;
      }
    }
    break;
  case 4:
    switch (BYTE_TO_ASCII(enc, ptr)) {
    case ASCII_q:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_u)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_t))
            return ASCII_QUOT;
        }
      }
      break;
    case ASCII_a:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_p)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_s))
            return ASCII_APOS;
        }
      }
      break;
    }
  }
  return 0;
}